

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

void set_auto_tiles(TileConfig *tile_cfg,uint width,uint height,uint threads)

{
  int iVar1;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  double dVar2;
  int tiles_log2;
  uint32_t tiles;
  uint32_t frame_area;
  uint32_t kMaxTiles;
  uint32_t kMinTileArea;
  int tile_rows_log2;
  int tile_cols_log2;
  undefined4 local_2c;
  undefined4 local_1c;
  undefined4 local_18;
  
  if (1 < in_ECX) {
    local_2c = in_ESI * in_EDX + 0x3fff >> 0xe;
    if (0x20 < local_2c) {
      local_2c = 0x20;
    }
    if (in_ECX < local_2c) {
      local_2c = in_ECX;
    }
    dVar2 = log2((double)local_2c);
    iVar1 = (int)dVar2;
    if (in_ESI < in_EDX) {
      local_1c = (iVar1 + 1) / 2;
      local_18 = iVar1 - local_1c;
    }
    else {
      local_18 = (iVar1 + 1) / 2;
      local_1c = iVar1 - local_18;
    }
    *(int *)(in_RDI + 8) = local_18;
    *(int *)(in_RDI + 0xc) = local_1c;
  }
  return;
}

Assistant:

static void set_auto_tiles(TileConfig *const tile_cfg, unsigned int width,
                           unsigned int height, unsigned int threads) {
  int tile_cols_log2 = 0;
  int tile_rows_log2 = 0;
  if (threads < 2) return;
  // Avoid small tiles because they are particularly bad for coding.
  // Use no more tiles than the number of threads. Aim for one tile per
  // thread. Using more than one thread inside one tile could be less
  // efficient. Using more tiles than the number of threads would result
  // in a compression penalty without much benefit.
  const uint32_t kMinTileArea = 128 * 128;
  const uint32_t kMaxTiles = 32;
  uint32_t frame_area = width * height;
  uint32_t tiles = (frame_area + kMinTileArea - 1) / kMinTileArea;
  if (tiles > kMaxTiles) {
    tiles = kMaxTiles;
  }
  if (tiles > threads) {
    tiles = threads;
  }
  int tiles_log2 = (int)log2(tiles);
  // If the frame width is equal or greater than the height, use more tile
  // columns than tile rows.
  if (width >= height) {
    tile_cols_log2 = (tiles_log2 + 1) / 2;
    tile_rows_log2 = tiles_log2 - tile_cols_log2;
  } else {
    tile_rows_log2 = (tiles_log2 + 1) / 2;
    tile_cols_log2 = tiles_log2 - tile_rows_log2;
  }
  tile_cfg->tile_columns = tile_cols_log2;
  tile_cfg->tile_rows = tile_rows_log2;
}